

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

int __thiscall QMetaObjectBuilder::indexOfProperty(QMetaObjectBuilder *this,QByteArray *name)

{
  pointer pQVar1;
  bool bVar2;
  reference pvVar3;
  pointer rhs;
  long lVar4;
  
  rhs = (this->d->properties).
        super__Vector_base<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pQVar1 = (this->d->properties).
           super__Vector_base<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = -(long)rhs;
  while( true ) {
    if (rhs == pQVar1) {
      return -1;
    }
    bVar2 = ::operator==(name,&rhs->name);
    if (bVar2) break;
    rhs = rhs + 1;
    lVar4 = lVar4 + -0x48;
  }
  pvVar3 = std::vector<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>::
           front(&this->d->properties);
  return (int)(-((long)&(pvVar3->name).d.d + lVar4) / 0x48);
}

Assistant:

int QMetaObjectBuilder::indexOfProperty(const QByteArray &name)
{
    for (const auto &property : d->properties) {
        if (name == property.name)
            return int(&property - &d->properties.front());
    }
    return -1;
}